

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_disconnect(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  DESCRIPTOR_DATA **dclose;
  char *txt;
  string_view fmt;
  char arg [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Disconnect whom?\n\r";
    goto LAB_0026b82f;
  }
  bVar2 = is_number(local_1218);
  if (bVar2) {
    iVar3 = atoi(local_1218);
    dclose = &descriptor_list;
    do {
      dclose = &((DESCRIPTOR_DATA *)dclose)->next->next;
      if ((DESCRIPTOR_DATA *)dclose == (DESCRIPTOR_DATA *)0x0) goto LAB_0026b780;
    } while (iVar3 != ((DESCRIPTOR_DATA *)dclose)->descriptor);
  }
  else {
LAB_0026b780:
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
      goto LAB_0026b82f;
    }
    sVar1 = ch->level;
    iVar3 = get_trust(ch_00);
    if (sVar1 <= iVar3) {
      txt = "Not at your level!\n\r";
      goto LAB_0026b82f;
    }
    if (ch_00->desc == (DESCRIPTOR_DATA *)0x0) {
      act("$N doesn\'t have a descriptor.",ch,(void *)0x0,ch_00,3);
      return;
    }
    dclose = &descriptor_list;
    do {
      dclose = &((DESCRIPTOR_DATA *)dclose)->next->next;
      if ((DESCRIPTOR_DATA *)dclose == (DESCRIPTOR_DATA *)0x0) {
        fmt._M_str = "Do_disconnect: desc not found.";
        fmt._M_len = 0x1e;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
        txt = "Descriptor not found!\n\r";
        goto LAB_0026b82f;
      }
    } while ((DESCRIPTOR_DATA *)dclose != ch_00->desc);
  }
  close_socket((DESCRIPTOR_DATA *)dclose);
  txt = "Ok.\n\r";
LAB_0026b82f:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_disconnect(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Disconnect whom?\n\r", ch);
		return;
	}

	if (is_number(arg))
	{
		int desc = atoi(arg);
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->descriptor == desc)
			{
				close_socket(d);
				send_to_char("Ok.\n\r", ch);
				return;
			}
		}
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->level <= get_trust(victim))
	{
		send_to_char("Not at your level!\n\r", ch);
		return;
	}

	if (victim->desc == nullptr)
	{
		act("$N doesn't have a descriptor.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == victim->desc)
		{
			close_socket(d);
			send_to_char("Ok.\n\r", ch);
			return;
		}
	}

	RS.Logger.Warn("Do_disconnect: desc not found.");
	send_to_char("Descriptor not found!\n\r", ch);
}